

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O1

void m2v_mult_col_from(m2v *M,int c,int offs,int alpha)

{
  m2v_base *pmVar1;
  byte bVar2;
  int iVar3;
  
  if ((alpha == 0) && (bVar2 = (byte)c & 0x1f, offs < M->n_row)) {
    pmVar1 = M->e;
    iVar3 = c + 0x1f;
    if (-1 < c) {
      iVar3 = c;
    }
    do {
      pmVar1[M->row_stride * offs + (iVar3 >> 5)] =
           pmVar1[M->row_stride * offs + (iVar3 >> 5)] & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2)
      ;
      offs = offs + 1;
    } while (offs < M->n_row);
  }
  return;
}

Assistant:

void m2v_mult_col_from(m2v* M, int c, int offs, int alpha)
{
	assert(0 <= c && c < M->n_col);
	assert(0 <= offs && offs <= M->n_row);

	if (alpha != 0)
		return;
	m2v_base m = ~get_mask(get_bit(M, c));
	for (int r = offs; r < M->n_row; ++r) {
		M->e[get_word(M, r, c)] &= m;
	}
}